

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardSubsumptionAndResolution.cpp
# Opt level: O0

void __thiscall
Inferences::BackwardSubsumptionAndResolution::perform
          (BackwardSubsumptionAndResolution *this,Clause *cl,
          BwSimplificationRecordIterator *simplifications)

{
  Clause *pCVar1;
  undefined8 uVar2;
  BwSimplificationRecord elem;
  BwSimplificationRecord elem_00;
  BwSimplificationRecord elem_01;
  BwSimplificationRecord elem_02;
  BwSimplificationRecord elem_03;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  Literal **ppLVar6;
  Clause *in_RSI;
  long in_RDI;
  Clause *conclusion_2;
  Clause *icl_3;
  VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
  it_3;
  Clause *conclusion_1;
  bool checkSR;
  bool checkS;
  Clause *icl_2;
  VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
  it_2;
  uint currVal;
  Literal *curr;
  uint i;
  uint lmVal;
  Literal *lit;
  Clause *conclusion;
  Clause *icl_1;
  QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause> res;
  VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
  it_1;
  Clause *icl;
  VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
  it;
  Literal *lit_1;
  List<Inferences::BwSimplificationRecord> *simplificationBuffer;
  Clause *in_stack_fffffffffffffdd8;
  Clause *in_stack_fffffffffffffde0;
  undefined6 in_stack_fffffffffffffde8;
  undefined1 in_stack_fffffffffffffdee;
  undefined1 in_stack_fffffffffffffdef;
  undefined6 in_stack_fffffffffffffdf0;
  undefined1 in_stack_fffffffffffffdf6;
  undefined1 in_stack_fffffffffffffdf7;
  Clause *in_stack_fffffffffffffdf8;
  undefined5 in_stack_fffffffffffffe00;
  undefined1 in_stack_fffffffffffffe05;
  byte in_stack_fffffffffffffe06;
  byte in_stack_fffffffffffffe07;
  Iterator in_stack_fffffffffffffe08;
  Iterator local_1a8 [3];
  Clause *in_stack_fffffffffffffe70;
  Literal *in_stack_fffffffffffffe78;
  Clause *in_stack_fffffffffffffe80;
  long local_170;
  BwSimplificationRecord local_158;
  Clause *local_148;
  BwSimplificationRecord local_140;
  byte local_12a;
  byte local_129;
  long local_118;
  SATSubsumptionAndResolution *local_110;
  uint local_fc;
  Term *local_f8;
  uint local_f0;
  uint local_ec;
  Term *local_e8;
  Iterator local_e0 [2];
  Iterator local_d0 [2];
  BwSimplificationRecord local_c0;
  Clause *local_b0;
  undefined4 local_a4;
  Clause *local_a0;
  long local_88;
  BwSimplificationRecord local_78 [2];
  long local_58;
  Clause *local_50;
  Literal *local_40;
  List<Inferences::BwSimplificationRecord> *local_38;
  Clause *local_10;
  
  local_10 = in_RSI;
  Lib::VirtualIterator<Inferences::BwSimplificationRecord>::getEmpty();
  Lib::VirtualIterator<Inferences::BwSimplificationRecord>::operator=
            ((VirtualIterator<Inferences::BwSimplificationRecord> *)
             CONCAT17(in_stack_fffffffffffffdf7,
                      CONCAT16(in_stack_fffffffffffffdf6,in_stack_fffffffffffffdf0)),
             (VirtualIterator<Inferences::BwSimplificationRecord> *)
             CONCAT17(in_stack_fffffffffffffdef,
                      CONCAT16(in_stack_fffffffffffffdee,in_stack_fffffffffffffde8)));
  Lib::VirtualIterator<Inferences::BwSimplificationRecord>::~VirtualIterator
            ((VirtualIterator<Inferences::BwSimplificationRecord> *)in_stack_fffffffffffffde0);
  if (((*(byte *)(in_RDI + 0x10) & 1) != 0) || ((*(byte *)(in_RDI + 0x11) & 1) != 0)) {
    Lib::DHSet<Kernel::Clause_*,_Lib::DefaultHash,_Lib::DefaultHash2>::reset
              ((DHSet<Kernel::Clause_*,_Lib::DefaultHash,_Lib::DefaultHash2> *)0x76b391);
    local_38 = Lib::List<Inferences::BwSimplificationRecord>::empty();
    uVar4 = Kernel::Clause::length(local_10);
    if (uVar4 == 1) {
      ppLVar6 = Kernel::Clause::operator[](local_10,0);
      local_40 = *ppLVar6;
      if ((*(byte *)(in_RDI + 0x10) & 1) != 0) {
        Indexing::LiteralIndex<Indexing::LiteralClause>::getInstances
                  ((LiteralIndex<Indexing::LiteralClause> *)in_stack_fffffffffffffdf8,
                   (Literal *)
                   CONCAT17(in_stack_fffffffffffffdf7,
                            CONCAT16(in_stack_fffffffffffffdf6,in_stack_fffffffffffffdf0)),
                   (bool)in_stack_fffffffffffffdef,(bool)in_stack_fffffffffffffdee);
        while (bVar3 = Lib::
                       VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
                       ::hasNext((VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
                                  *)0x76b411), bVar3) {
          Lib::
          VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
          ::next((VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
                  *)in_stack_fffffffffffffdd8);
          pCVar1 = *(Clause **)(local_58 + 8);
          Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>::
          ~QueryRes((QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>
                     *)0x76b459);
          local_50 = pCVar1;
          bVar3 = Lib::DHSet<Kernel::Clause_*,_Lib::DefaultHash,_Lib::DefaultHash2>::insert
                            ((DHSet<Kernel::Clause_*,_Lib::DefaultHash,_Lib::DefaultHash2> *)
                             in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
          if (bVar3) {
            *(int *)(DAT_01333840 + 0x1b8) = *(int *)(DAT_01333840 + 0x1b8) + 1;
            BwSimplificationRecord::BwSimplificationRecord(local_78,local_50);
            elem.toRemove._6_1_ = in_stack_fffffffffffffdee;
            elem.toRemove._0_6_ = in_stack_fffffffffffffde8;
            elem.toRemove._7_1_ = in_stack_fffffffffffffdef;
            elem.replacement._0_6_ = in_stack_fffffffffffffdf0;
            elem.replacement._6_1_ = in_stack_fffffffffffffdf6;
            elem.replacement._7_1_ = in_stack_fffffffffffffdf7;
            Lib::List<Inferences::BwSimplificationRecord>::push
                      (elem,(List<Inferences::BwSimplificationRecord> **)in_stack_fffffffffffffde0);
          }
        }
        Lib::
        VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
        ::~VirtualIterator((VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
                            *)in_stack_fffffffffffffde0);
      }
      if ((*(byte *)(in_RDI + 0x11) & 1) != 0) {
        Indexing::LiteralIndex<Indexing::LiteralClause>::getInstances
                  ((LiteralIndex<Indexing::LiteralClause> *)in_stack_fffffffffffffdf8,
                   (Literal *)
                   CONCAT17(in_stack_fffffffffffffdf7,
                            CONCAT16(in_stack_fffffffffffffdf6,in_stack_fffffffffffffdf0)),
                   (bool)in_stack_fffffffffffffdef,(bool)in_stack_fffffffffffffdee);
        while (bVar3 = Lib::
                       VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
                       ::hasNext((VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
                                  *)0x76b55d), bVar3) {
          Lib::
          VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
          ::next((VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
                  *)in_stack_fffffffffffffdd8);
          local_a0 = *(Clause **)(local_88 + 8);
          bVar3 = Lib::DHSet<Kernel::Clause_*,_Lib::DefaultHash,_Lib::DefaultHash2>::insert
                            ((DHSet<Kernel::Clause_*,_Lib::DefaultHash,_Lib::DefaultHash2> *)
                             in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
          if (bVar3) {
            local_b0 = SATSubsumption::SATSubsumptionAndResolution::
                       getSubsumptionResolutionConclusion
                                 (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                                  in_stack_fffffffffffffe70);
            *(int *)(DAT_01333840 + 0x144) = *(int *)(DAT_01333840 + 0x144) + 1;
            BwSimplificationRecord::BwSimplificationRecord(&local_c0,local_a0,local_b0);
            elem_00.toRemove._6_1_ = in_stack_fffffffffffffdee;
            elem_00.toRemove._0_6_ = in_stack_fffffffffffffde8;
            elem_00.toRemove._7_1_ = in_stack_fffffffffffffdef;
            elem_00.replacement._0_6_ = in_stack_fffffffffffffdf0;
            elem_00.replacement._6_1_ = in_stack_fffffffffffffdf6;
            elem_00.replacement._7_1_ = in_stack_fffffffffffffdf7;
            Lib::List<Inferences::BwSimplificationRecord>::push
                      (elem_00,(List<Inferences::BwSimplificationRecord> **)
                               in_stack_fffffffffffffde0);
            local_a4 = 0;
          }
          else {
            local_a4 = 4;
          }
          Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>::
          ~QueryRes((QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>
                     *)0x76b6b6);
        }
        Lib::
        VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
        ::~VirtualIterator((VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
                            *)in_stack_fffffffffffffde0);
      }
      if (local_38 != (List<Inferences::BwSimplificationRecord> *)0x0) {
        Lib::List<Inferences::BwSimplificationRecord>::Iterator::Iterator(local_d0,local_38);
        Lib::pvi<Lib::List<Inferences::BwSimplificationRecord>::Iterator>(in_stack_fffffffffffffe08)
        ;
        Lib::VirtualIterator<Inferences::BwSimplificationRecord>::operator=
                  ((VirtualIterator<Inferences::BwSimplificationRecord> *)
                   CONCAT17(in_stack_fffffffffffffdf7,
                            CONCAT16(in_stack_fffffffffffffdf6,in_stack_fffffffffffffdf0)),
                   (VirtualIterator<Inferences::BwSimplificationRecord> *)
                   CONCAT17(in_stack_fffffffffffffdef,
                            CONCAT16(in_stack_fffffffffffffdee,in_stack_fffffffffffffde8)));
        Lib::VirtualIterator<Inferences::BwSimplificationRecord>::~VirtualIterator
                  ((VirtualIterator<Inferences::BwSimplificationRecord> *)in_stack_fffffffffffffde0)
        ;
      }
    }
    else if (((*(byte *)(in_RDI + 0x12) & 1) == 0) || ((*(byte *)(in_RDI + 0x13) & 1) == 0)) {
      ppLVar6 = Kernel::Clause::operator[](local_10,0);
      local_e8 = &(*ppLVar6)->super_Term;
      local_ec = Kernel::Term::weight(local_e8);
      for (local_f0 = 1; uVar4 = local_f0, uVar5 = Kernel::Clause::length(local_10), uVar4 < uVar5;
          local_f0 = local_f0 + 1) {
        ppLVar6 = Kernel::Clause::operator[](local_10,local_f0);
        local_f8 = &(*ppLVar6)->super_Term;
        local_fc = Kernel::Term::weight(local_f8);
        if (local_ec < local_fc) {
          local_e8 = local_f8;
          local_ec = local_fc;
        }
      }
      if ((*(byte *)(in_RDI + 0x12) & 1) == 0) {
        Indexing::LiteralIndex<Indexing::LiteralClause>::getInstances
                  ((LiteralIndex<Indexing::LiteralClause> *)in_stack_fffffffffffffdf8,
                   (Literal *)
                   CONCAT17(in_stack_fffffffffffffdf7,
                            CONCAT16(in_stack_fffffffffffffdf6,in_stack_fffffffffffffdf0)),
                   (bool)in_stack_fffffffffffffdef,(bool)in_stack_fffffffffffffdee);
        while (bVar3 = Lib::
                       VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
                       ::hasNext((VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
                                  *)0x76b930), bVar3) {
          Lib::
          VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
          ::next((VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
                  *)in_stack_fffffffffffffdd8);
          in_stack_fffffffffffffe08._lst =
               *(List<Inferences::BwSimplificationRecord> **)(local_118 + 8);
          Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>::
          ~QueryRes((QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>
                     *)0x76b978);
          local_110 = (SATSubsumptionAndResolution *)in_stack_fffffffffffffe08._lst;
          bVar3 = Lib::DHSet<Kernel::Clause_*,_Lib::DefaultHash,_Lib::DefaultHash2>::insert
                            ((DHSet<Kernel::Clause_*,_Lib::DefaultHash,_Lib::DefaultHash2> *)
                             in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
          if (bVar3) {
            in_stack_fffffffffffffe07 = 0;
            if ((*(byte *)(in_RDI + 0x10) & 1) != 0) {
              in_stack_fffffffffffffe07 = *(byte *)(in_RDI + 0x12) ^ 0xff;
            }
            local_129 = in_stack_fffffffffffffe07 & 1;
            in_stack_fffffffffffffe06 = 0;
            if ((*(byte *)(in_RDI + 0x11) & 1) != 0) {
              in_stack_fffffffffffffe06 = *(byte *)(in_RDI + 0x13) ^ 0xff;
            }
            local_12a = in_stack_fffffffffffffe06 & 1;
            if ((local_129 == 0) ||
               (in_stack_fffffffffffffe05 =
                     SATSubsumption::SATSubsumptionAndResolution::checkSubsumption
                               ((SATSubsumptionAndResolution *)in_stack_fffffffffffffe08._lst,
                                (Clause *)
                                CONCAT17(in_stack_fffffffffffffe07,
                                         CONCAT16(in_stack_fffffffffffffe06,
                                                  CONCAT15(in_stack_fffffffffffffe05,
                                                           in_stack_fffffffffffffe00))),
                                in_stack_fffffffffffffdf8,(bool)in_stack_fffffffffffffdf7),
               !(bool)in_stack_fffffffffffffe05)) {
              if (((local_12a & 1) != 0) &&
                 (in_stack_fffffffffffffdf8 =
                       SATSubsumption::SATSubsumptionAndResolution::checkSubsumptionResolution
                                 ((SATSubsumptionAndResolution *)in_stack_fffffffffffffe08._lst,
                                  (Clause *)
                                  CONCAT17(in_stack_fffffffffffffe07,
                                           CONCAT16(in_stack_fffffffffffffe06,
                                                    CONCAT15(in_stack_fffffffffffffe05,
                                                             in_stack_fffffffffffffe00))),
                                  in_stack_fffffffffffffdf8,(bool)in_stack_fffffffffffffdf7),
                 local_148 = in_stack_fffffffffffffdf8, in_stack_fffffffffffffdf8 != (Clause *)0x0))
              {
                *(int *)(DAT_01333840 + 0x144) = *(int *)(DAT_01333840 + 0x144) + 1;
                BwSimplificationRecord::BwSimplificationRecord
                          (&local_158,(Clause *)local_110,in_stack_fffffffffffffdf8);
                elem_02.toRemove._6_1_ = in_stack_fffffffffffffdee;
                elem_02.toRemove._0_6_ = in_stack_fffffffffffffde8;
                elem_02.toRemove._7_1_ = in_stack_fffffffffffffdef;
                elem_02.replacement._0_6_ = in_stack_fffffffffffffdf0;
                elem_02.replacement._6_1_ = in_stack_fffffffffffffdf6;
                elem_02.replacement._7_1_ = in_stack_fffffffffffffdf7;
                Lib::List<Inferences::BwSimplificationRecord>::push
                          (elem_02,(List<Inferences::BwSimplificationRecord> **)
                                   in_stack_fffffffffffffde0);
              }
            }
            else {
              *(int *)(DAT_01333840 + 0x1b8) = *(int *)(DAT_01333840 + 0x1b8) + 1;
              BwSimplificationRecord::BwSimplificationRecord(&local_140,(Clause *)local_110);
              elem_01.toRemove._6_1_ = in_stack_fffffffffffffdee;
              elem_01.toRemove._0_6_ = in_stack_fffffffffffffde8;
              elem_01.toRemove._7_1_ = in_stack_fffffffffffffdef;
              elem_01.replacement._0_6_ = in_stack_fffffffffffffdf0;
              elem_01.replacement._6_1_ = in_stack_fffffffffffffdf6;
              elem_01.replacement._7_1_ = in_stack_fffffffffffffdf7;
              Lib::List<Inferences::BwSimplificationRecord>::push
                        (elem_01,(List<Inferences::BwSimplificationRecord> **)
                                 in_stack_fffffffffffffde0);
            }
          }
        }
        Lib::
        VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
        ::~VirtualIterator((VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
                            *)in_stack_fffffffffffffde0);
      }
      if (((*(byte *)(in_RDI + 0x11) & 1) != 0) && ((*(byte *)(in_RDI + 0x13) & 1) == 0)) {
        Indexing::LiteralIndex<Indexing::LiteralClause>::getInstances
                  ((LiteralIndex<Indexing::LiteralClause> *)in_stack_fffffffffffffdf8,
                   (Literal *)
                   CONCAT17(in_stack_fffffffffffffdf7,
                            CONCAT16(in_stack_fffffffffffffdf6,in_stack_fffffffffffffdf0)),
                   (bool)in_stack_fffffffffffffdef,(bool)in_stack_fffffffffffffdee);
        while (in_stack_fffffffffffffdf7 =
                    Lib::
                    VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
                    ::hasNext((VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
                               *)0x76bbe2), (bool)in_stack_fffffffffffffdf7) {
          Lib::
          VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
          ::next((VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
                  *)in_stack_fffffffffffffdd8);
          uVar2 = *(undefined8 *)(local_170 + 8);
          in_stack_fffffffffffffde8 = (undefined6)uVar2;
          in_stack_fffffffffffffdee = (undefined1)((ulong)uVar2 >> 0x30);
          in_stack_fffffffffffffdef = (undefined1)((ulong)uVar2 >> 0x38);
          Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>::
          ~QueryRes((QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>
                     *)0x76bc2a);
          pCVar1 = (Clause *)
                   CONCAT17(in_stack_fffffffffffffdef,
                            CONCAT16(in_stack_fffffffffffffdee,in_stack_fffffffffffffde8));
          in_stack_fffffffffffffdf6 =
               Lib::DHSet<Kernel::Clause_*,_Lib::DefaultHash,_Lib::DefaultHash2>::insert
                         ((DHSet<Kernel::Clause_*,_Lib::DefaultHash,_Lib::DefaultHash2> *)
                          in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
          if (((bool)in_stack_fffffffffffffdf6) &&
             (in_stack_fffffffffffffde0 =
                   SATSubsumption::SATSubsumptionAndResolution::checkSubsumptionResolution
                             ((SATSubsumptionAndResolution *)in_stack_fffffffffffffe08._lst,
                              (Clause *)
                              CONCAT17(in_stack_fffffffffffffe07,
                                       CONCAT16(in_stack_fffffffffffffe06,
                                                CONCAT15(in_stack_fffffffffffffe05,
                                                         in_stack_fffffffffffffe00))),
                              in_stack_fffffffffffffdf8,(bool)in_stack_fffffffffffffdf7),
             in_stack_fffffffffffffde0 != (Clause *)0x0)) {
            *(int *)(DAT_01333840 + 0x144) = *(int *)(DAT_01333840 + 0x144) + 1;
            BwSimplificationRecord::BwSimplificationRecord
                      ((BwSimplificationRecord *)(local_1a8 + 2),pCVar1,in_stack_fffffffffffffde0);
            elem_03.toRemove._6_1_ = in_stack_fffffffffffffdee;
            elem_03.toRemove._0_6_ = in_stack_fffffffffffffde8;
            elem_03.toRemove._7_1_ = in_stack_fffffffffffffdef;
            elem_03.replacement._0_6_ = in_stack_fffffffffffffdf0;
            elem_03.replacement._6_1_ = in_stack_fffffffffffffdf6;
            elem_03.replacement._7_1_ = in_stack_fffffffffffffdf7;
            Lib::List<Inferences::BwSimplificationRecord>::push
                      (elem_03,(List<Inferences::BwSimplificationRecord> **)
                               in_stack_fffffffffffffde0);
          }
        }
        Lib::
        VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
        ::~VirtualIterator((VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
                            *)in_stack_fffffffffffffde0);
      }
      if (local_38 != (List<Inferences::BwSimplificationRecord> *)0x0) {
        Lib::List<Inferences::BwSimplificationRecord>::Iterator::Iterator(local_1a8,local_38);
        Lib::pvi<Lib::List<Inferences::BwSimplificationRecord>::Iterator>(in_stack_fffffffffffffe08)
        ;
        Lib::VirtualIterator<Inferences::BwSimplificationRecord>::operator=
                  ((VirtualIterator<Inferences::BwSimplificationRecord> *)
                   CONCAT17(in_stack_fffffffffffffdf7,
                            CONCAT16(in_stack_fffffffffffffdf6,in_stack_fffffffffffffdf0)),
                   (VirtualIterator<Inferences::BwSimplificationRecord> *)
                   CONCAT17(in_stack_fffffffffffffdef,
                            CONCAT16(in_stack_fffffffffffffdee,in_stack_fffffffffffffde8)));
        Lib::VirtualIterator<Inferences::BwSimplificationRecord>::~VirtualIterator
                  ((VirtualIterator<Inferences::BwSimplificationRecord> *)in_stack_fffffffffffffde0)
        ;
      }
    }
    else if (local_38 != (List<Inferences::BwSimplificationRecord> *)0x0) {
      Lib::List<Inferences::BwSimplificationRecord>::Iterator::Iterator(local_e0,local_38);
      Lib::pvi<Lib::List<Inferences::BwSimplificationRecord>::Iterator>(in_stack_fffffffffffffe08);
      Lib::VirtualIterator<Inferences::BwSimplificationRecord>::operator=
                ((VirtualIterator<Inferences::BwSimplificationRecord> *)
                 CONCAT17(in_stack_fffffffffffffdf7,
                          CONCAT16(in_stack_fffffffffffffdf6,in_stack_fffffffffffffdf0)),
                 (VirtualIterator<Inferences::BwSimplificationRecord> *)
                 CONCAT17(in_stack_fffffffffffffdef,
                          CONCAT16(in_stack_fffffffffffffdee,in_stack_fffffffffffffde8)));
      Lib::VirtualIterator<Inferences::BwSimplificationRecord>::~VirtualIterator
                ((VirtualIterator<Inferences::BwSimplificationRecord> *)in_stack_fffffffffffffde0);
    }
  }
  return;
}

Assistant:

void BackwardSubsumptionAndResolution::perform(Clause *cl,
                                               BwSimplificationRecordIterator &simplifications)
{
  ASSERT_VALID(*cl)
  ASS(_bwIndex)
  simplifications = BwSimplificationRecordIterator::getEmpty();

  if (!_subsumption && !_subsumptionResolution) {
    return;
  }

  _checked.reset();

  // contains the list of simplifications found so far
  List<BwSimplificationRecord> *simplificationBuffer = List<BwSimplificationRecord>::empty();

  /********************************************************/
  /*                      cl is UNIT                      */
  /********************************************************/
  // cl is a unit clause and will subsume all clauses that contain its literal
  // and will be resolved with all clauses that contain its negation
  if (cl->length() == 1) {
    Literal *lit = (*cl)[0];
    // Check for the subsumptions
    if (_subsumption) {
      /***************************************************/
      /*            SUBSUMPTION UNIT CLAUSE              */
      /***************************************************/
      auto it = _bwIndex->getInstances(lit, false, false);
      while (it.hasNext()) {
        Clause *icl = it.next().data->clause;
        if (!_checked.insert(icl))
          continue;
        env.statistics->backwardSubsumed++;
        List<BwSimplificationRecord>::push(BwSimplificationRecord(icl), simplificationBuffer);
      }
    }
    if (_subsumptionResolution) {
      /***************************************************/
      /*      SUBSUMPTION RESOLUTION UNIT CLAUSE         */
      /***************************************************/
      auto it = _bwIndex->getInstances(lit, true, false);
      while (it.hasNext()) {
        auto res = it.next();
        Clause *icl = res.data->clause;
        if (!_checked.insert(icl))
          continue;
        Clause *conclusion = SATSubsumption::SATSubsumptionAndResolution::getSubsumptionResolutionConclusion(icl, res.data->literal, cl);
        ASS(conclusion)
        env.statistics->backwardSubsumptionResolution++;
        List<BwSimplificationRecord>::push(BwSimplificationRecord(icl, conclusion), simplificationBuffer);
      }
    }
    if (simplificationBuffer)
      simplifications = pvi(List<BwSimplificationRecord>::Iterator(simplificationBuffer));
    return;
  }

  if (_subsumptionByUnitsOnly && _srByUnitsOnly) {
    ASS(!simplificationBuffer)
    if (simplificationBuffer)
      simplifications = pvi(List<BwSimplificationRecord>::Iterator(simplificationBuffer));
    return;
  }

  /*******************************************************/
  /*       SUBSUMPTION & RESOLUTION MULTI-LITERAL        */
  /*******************************************************/
  // We use the optimization from Krystof Hoder and only search the instances of the least matchable
  // literal. Indeed, since for subsumption and subsumption resolution, each literal in the subsuming
  // clause S must be matched at least one literal in the subsumed clause M (idem for SR).
  // Therefore checking the instances of the least matchable literal will limit the number of candidates
  // for both subsumption and subsumption resolution.
  // For now, the least matchable literal is the heaviest literal in the clause. But this heuristic
  // could probably be improved.
  Literal* lit = (*cl)[0];
  unsigned lmVal = lit->weight();
  for(unsigned i = 1; i < cl->length(); i++) {
    Literal* curr = (*cl)[i];
    unsigned currVal = curr->weight();
    if(currVal > lmVal) {
      lit = curr;
      lmVal = currVal;
    }
  }

  if (!_subsumptionByUnitsOnly) {
    // find the positively matched literals
    auto it = _bwIndex->getInstances(lit, false, false);
    while (it.hasNext()) {
      Clause *icl = it.next().data->clause;
      if (!_checked.insert(icl))
        continue;
      // check subsumption and setup subsumption resolution at the same time
      bool checkS = _subsumption && !_subsumptionByUnitsOnly;
      bool checkSR = _subsumptionResolution && !_srByUnitsOnly;
      if (checkS) {
        if (_satSubs.checkSubsumption(cl, icl, checkSR)) {
          env.statistics->backwardSubsumed++;
          List<BwSimplificationRecord>::push(BwSimplificationRecord(icl), simplificationBuffer);
          continue;
        }
      }
      if (checkSR) {
        // check subsumption resolution
        Clause *conclusion = _satSubs.checkSubsumptionResolution(cl, icl, checkS); // use the previous setup only if subsumption was checked
        if (conclusion) {
          env.statistics->backwardSubsumptionResolution++;
          List<BwSimplificationRecord>::push(BwSimplificationRecord(icl, conclusion), simplificationBuffer);
        }
      }
    }
  }

  /*******************************************************/
  /*       SUBSUMPTION RESOLUTION MULTI-LITERAL          */
  /*******************************************************/
  if (_subsumptionResolution && !_srByUnitsOnly) {
    // find the negatively matched literals
    // We can use the same least matchable literal as before since our method is agnostic to the
    // flipped literal
    auto it = _bwIndex->getInstances(lit, true, false);
    while (it.hasNext()) {
      Clause *icl = it.next().data->clause;
      if (!_checked.insert(icl))
        continue;
      // check subsumption resolution
      Clause *conclusion = _satSubs.checkSubsumptionResolution(cl, icl, false);
      if (conclusion) {
        env.statistics->backwardSubsumptionResolution++;
        List<BwSimplificationRecord>::push(BwSimplificationRecord(icl, conclusion), simplificationBuffer);
      }
    }
  }

  if (simplificationBuffer) {
    simplifications = pvi(List<BwSimplificationRecord>::Iterator(simplificationBuffer));
  }
}